

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  OPJ_INT32 OVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int local_183c;
  int local_1838;
  int orient;
  int lut_nmsedec_ref0 [128];
  int lut_nmsedec_ref [128];
  int lut_nmsedec_sig0 [128];
  int lut_nmsedec_sig [128];
  int lut_ctxno_zc [1024];
  double t;
  double v;
  double u;
  int j;
  int i;
  char **argv_local;
  int argc_local;
  
  printf("/* This file was automatically generated by t1_generate_luts.c */\n\n");
  for (u._0_4_ = 0; u._0_4_ < 4; u._0_4_ = u._0_4_ + 1) {
    for (u._4_4_ = 0; (int)u._4_4_ < 0x100; u._4_4_ = u._4_4_ + 1) {
      local_183c = u._0_4_;
      if (u._0_4_ == 2) {
        local_183c = 1;
      }
      else if (u._0_4_ == 1) {
        local_183c = 2;
      }
      iVar1 = t1_init_ctxno_zc(u._4_4_,u._0_4_);
      lut_nmsedec_sig[(long)(int)(local_183c << 8 | u._4_4_) + 0x7e] = iVar1;
    }
  }
  printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
  for (u._4_4_ = 0; (int)u._4_4_ < 0x3ff; u._4_4_ = u._4_4_ + 1) {
    printf("%i, ",(ulong)(uint)lut_nmsedec_sig[(long)(int)u._4_4_ + 0x7e]);
    if ((u._4_4_ + 1 & 0x1f) == 0) {
      printf("\n  ");
    }
  }
  printf("%i\n};\n\n",(ulong)(uint)lut_ctxno_zc[0x3fd]);
  printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
  for (u._4_4_ = 0; (int)u._4_4_ < 0xff; u._4_4_ = u._4_4_ + 1) {
    uVar2 = t1_init_ctxno_sc(u._4_4_ << 4);
    printf("0x%x, ",(ulong)uVar2);
    if ((u._4_4_ + 1 & 0xf) == 0) {
      printf("\n  ");
    }
  }
  uVar2 = t1_init_ctxno_sc(0xff0);
  printf("0x%x\n};\n\n",(ulong)uVar2);
  printf("static OPJ_BYTE lut_spb[256] = {\n  ");
  for (u._4_4_ = 0; (int)u._4_4_ < 0xff; u._4_4_ = u._4_4_ + 1) {
    uVar2 = t1_init_spb(u._4_4_ << 4);
    printf("%i, ",(ulong)uVar2);
    if ((u._4_4_ + 1 & 0x1f) == 0) {
      printf("\n  ");
    }
  }
  uVar2 = t1_init_spb(0xff0);
  printf("%i\n};\n\n",(ulong)uVar2);
  for (u._4_4_ = 0; (int)u._4_4_ < 0x80; u._4_4_ = u._4_4_ + 1) {
    dVar4 = pow(2.0,6.0);
    dVar4 = (double)(int)u._4_4_ / dVar4;
    dVar5 = pow(2.0,6.0);
    dVar5 = floor((dVar4 * dVar4 + -((dVar4 - 1.5) * (dVar4 - 1.5))) * dVar5 + 0.5);
    dVar6 = pow(2.0,6.0);
    OVar3 = opj_int_max(0,(int)((dVar5 / dVar6) * 8192.0));
    lut_nmsedec_sig0[(long)(int)u._4_4_ + 0x7e] = OVar3;
    dVar5 = pow(2.0,6.0);
    dVar5 = floor(dVar4 * dVar4 * dVar5 + 0.5);
    dVar6 = pow(2.0,6.0);
    OVar3 = opj_int_max(0,(int)((dVar5 / dVar6) * 8192.0));
    lut_nmsedec_ref[(long)(int)u._4_4_ + 0x7e] = OVar3;
    dVar5 = dVar4 - 1.0;
    if ((u._4_4_ & 0x40) == 0) {
      t = dVar4 - 0.5;
    }
    else {
      t = dVar4 - 1.5;
    }
    dVar4 = pow(2.0,6.0);
    dVar4 = floor((dVar5 * dVar5 + -(t * t)) * dVar4 + 0.5);
    dVar6 = pow(2.0,6.0);
    OVar3 = opj_int_max(0,(int)((dVar4 / dVar6) * 8192.0));
    lut_nmsedec_ref0[(long)(int)u._4_4_ + 0x7e] = OVar3;
    dVar4 = pow(2.0,6.0);
    dVar4 = floor(dVar5 * dVar5 * dVar4 + 0.5);
    dVar5 = pow(2.0,6.0);
    OVar3 = opj_int_max(0,(int)((dVar4 / dVar5) * 8192.0));
    (&local_1838)[(int)u._4_4_] = OVar3;
  }
  printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16(lut_nmsedec_sig0 + 0x7e,0x80);
  printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16(lut_nmsedec_ref + 0x7e,0x80);
  printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16(lut_nmsedec_ref0 + 0x7e,0x80);
  printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16(&local_1838,0x80);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	int i, j;
	double u, v, t;

	int lut_ctxno_zc[1024];
	int lut_nmsedec_sig[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS];
  (void)argc; (void)argv;

	printf("/* This file was automatically generated by t1_generate_luts.c */\n\n");

	/* lut_ctxno_zc */
	for (j = 0; j < 4; ++j) {
		for (i = 0; i < 256; ++i) {
			int orient = j;
			if (orient == 2) {
				orient = 1;
			} else if (orient == 1) {
				orient = 2;
			}
			lut_ctxno_zc[(orient << 8) | i] = t1_init_ctxno_zc(i, j);
		}
	}

	printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
	for (i = 0; i < 1023; ++i) {
		printf("%i, ", lut_ctxno_zc[i]);
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", lut_ctxno_zc[1023]);

	/* lut_ctxno_sc */
	printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("0x%x, ", t1_init_ctxno_sc(i << 4));
		if(!((i+1)&0xf))
			printf("\n  ");
	}
	printf("0x%x\n};\n\n", t1_init_ctxno_sc(255 << 4));

	/* lut_spb */
	printf("static OPJ_BYTE lut_spb[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("%i, ", t1_init_spb(i << 4));
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", t1_init_spb(255 << 4));

	/* FIXME FIXME FIXME */
	/* fprintf(stdout,"nmsedec luts:\n"); */
	for (i = 0; i < (1 << T1_NMSEDEC_BITS); ++i) {
		t = i / pow(2, T1_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		lut_nmsedec_sig[i] = 
			opj_int_max(0, 
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_sig0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		u = t - 1.0;
		if (i & (1 << (T1_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		lut_nmsedec_ref[i] =
			opj_int_max(0,
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_ref0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
	}

	printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig0, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref0, 1 << T1_NMSEDEC_BITS);

	return 0;
}